

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O3

void psset_stats_insert(psset_t *psset,hpdata_t *ps)

{
  psset_bin_stats_t *ppVar1;
  size_t *psVar2;
  long *plVar3;
  _Bool _Var4;
  pszind_t pVar5;
  size_t sVar6;
  size_t sVar7;
  psset_bin_stats_t *ppVar8;
  long lVar9;
  size_t sVar10;
  
  if (ps->h_nactive == 0x200) {
    _Var4 = ps->h_huge;
    ppVar8 = (psset->stats).full_slabs + _Var4;
    sVar7 = ppVar8->nactive;
    ppVar1 = (psset->stats).full_slabs + _Var4;
    ppVar1->npageslabs = ppVar8->npageslabs + 1;
    ppVar1->nactive = sVar7 + 0x200;
    sVar7 = ps->h_ntouched - 0x200;
    psVar2 = &(psset->stats).full_slabs[_Var4].ndirty;
    *psVar2 = *psVar2 + sVar7;
    sVar6 = 0x200;
  }
  else {
    if (ps->h_nactive == 0) {
      ppVar8 = (psset_bin_stats_t *)(psset->to_purge + (ulong)ps->h_huge * 3 + -5);
      ppVar1 = (psset->stats).empty_slabs + ps->h_huge;
      ppVar1->npageslabs = ppVar1->npageslabs + 1;
      sVar7 = ps->h_ntouched;
      sVar6 = 1;
      lVar9 = 0x408;
      sVar10 = sVar7;
      goto LAB_01d7b218;
    }
    pVar5 = psset_hpdata_heap_index((hpdata_t *)ps->h_longest_free_range);
    _Var4 = ps->h_huge;
    sVar6 = ps->h_nactive;
    ppVar8 = (psset->stats).nonfull_slabs[pVar5] + _Var4;
    sVar7 = ppVar8->nactive;
    ppVar1 = (psset->stats).nonfull_slabs[pVar5] + _Var4;
    ppVar1->npageslabs = ppVar8->npageslabs + 1;
    ppVar1->nactive = sVar6 + sVar7;
    sVar7 = ps->h_ntouched - sVar6;
    psVar2 = &(psset->stats).nonfull_slabs[pVar5][_Var4].ndirty;
    *psVar2 = *psVar2 + sVar7;
  }
  ppVar8 = &psset->merged_stats;
  lVar9 = 0x410;
  sVar10 = 1;
LAB_01d7b218:
  ((anon_struct_8_1_803fbc3e_for_head *)&ppVar8->npageslabs)->qlh_first =
       (hpdata_t *)
       ((long)((anon_struct_8_1_803fbc3e_for_head *)&ppVar8->npageslabs)->qlh_first->active_pages +
       (sVar10 - 0x70));
  plVar3 = (long *)((long)&psset->pageslabs[0].ph.root + lVar9);
  *plVar3 = *plVar3 + sVar6;
  psVar2 = &(psset->merged_stats).ndirty;
  *psVar2 = *psVar2 + sVar7;
  return;
}

Assistant:

static void
psset_stats_insert(psset_t* psset, hpdata_t *ps) {
	if (hpdata_empty(ps)) {
		psset_bin_stats_insert(psset, psset->stats.empty_slabs, ps);
	} else if (hpdata_full(ps)) {
		psset_bin_stats_insert(psset, psset->stats.full_slabs, ps);
	} else {
		pszind_t pind = psset_hpdata_heap_index(ps);
		psset_bin_stats_insert(psset, psset->stats.nonfull_slabs[pind],
		    ps);
	}
}